

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O0

SyntaxTreeNode * __thiscall
RegexToDFAConverter::factor_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  value_type vVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar2;
  int iVar3;
  SyntaxTreeNode *this_00;
  char *pcVar4;
  value_type *pvVar5;
  reference pvVar6;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar7;
  reference piVar8;
  reference this_01;
  int iVar9;
  int local_ac;
  _Node_iterator_base<int,_false> _Stack_a8;
  int second;
  iterator __end3;
  iterator __begin3;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range3;
  _Node_iterator_base<int,_false> _Stack_88;
  int first;
  iterator __end2;
  iterator __begin2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range2;
  iterator local_68;
  undefined8 local_60;
  int local_54;
  iterator local_50;
  undefined8 local_48;
  SyntaxTreeNode *local_40;
  SyntaxTreeNode *son;
  SyntaxTreeNode *local_28;
  SyntaxTreeNode *root;
  int *curr_pos_local;
  string *expr_local;
  RegexToDFAConverter *this_local;
  
  root = (SyntaxTreeNode *)curr_pos;
  curr_pos_local = (int *)expr;
  expr_local = (string *)this;
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  SyntaxTreeNode::SyntaxTreeNode(this_00);
  local_28 = this_00;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
  if (*pcVar4 == '(') {
    *(int *)&(root->sons).
             super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start =
         *(int *)&(root->sons).
                  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    local_40 = expression_eval(this,(string *)curr_pos_local,(int *)root);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
              (&local_28->first_pos,&local_40->first_pos);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
              (&local_28->last_pos,&local_40->last_pos);
    std::
    vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
    ::push_back(&local_28->sons,&local_40);
    local_28->nullable = (bool)(local_40->nullable & 1);
    SyntaxTreeNode::wipe_sons(local_28);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
    if (*pcVar4 == '$') {
      local_28->nullable = true;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
      bVar2 = is_letter(this,*pcVar4);
      if ((bVar2) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local), *pcVar4 == '#'))
      {
        this->leaves_count_ = this->leaves_count_ + 1;
        std::
        vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
        ::resize(&this->follow_pos_,(long)this->leaves_count_ + 1);
        std::vector<char,_std::allocator<char>_>::resize
                  (&this->what_letter_,(long)this->leaves_count_ + 1);
        local_28->nullable = false;
        local_54 = this->leaves_count_;
        local_50 = &local_54;
        local_48 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_50;
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
                  (&local_28->first_pos,__l_00);
        __range2._4_4_ = this->leaves_count_;
        local_68 = (iterator)((long)&__range2 + 4);
        local_60 = 1;
        __l._M_len = 1;
        __l._M_array = local_68;
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
                  (&local_28->last_pos,__l);
        local_28->leaf_index = this->leaves_count_;
        pvVar5 = (value_type *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
        vVar1 = *pvVar5;
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->what_letter_,(long)this->leaves_count_);
        *pvVar6 = vVar1;
      }
      else {
        local_28->nullable = true;
        *(int *)&(root->sons).
                 super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(root->sons).
                      super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + -1;
      }
    }
  }
  iVar9 = *(int *)&(root->sons).
                   super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
  *(int *)&(root->sons).
           super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start = iVar9;
  iVar3 = std::__cxx11::string::size();
  if ((iVar9 < iVar3) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local), *pcVar4 == '*')) {
    local_28->nullable = true;
    puVar7 = &local_28->last_pos;
    __end2 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin(puVar7);
    _Stack_88._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   (puVar7);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<int,_false>,&stack0xffffffffffffff78
                             ), bVar2) {
      piVar8 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end2);
      iVar3 = *piVar8;
      puVar7 = &local_28->first_pos;
      __end3 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               begin(puVar7);
      _Stack_a8._M_cur =
           (__node_type *)
           std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                     (puVar7);
      while (bVar2 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<int,_false>,
                                &stack0xffffffffffffff58), bVar2) {
        piVar8 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end3);
        local_ac = *piVar8;
        this_01 = std::
                  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow_pos_,(long)iVar3);
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                  (this_01,&local_ac);
        std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end3);
      }
      std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end2);
    }
  }
  while( true ) {
    iVar3 = *(int *)&(root->sons).
                     super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = std::__cxx11::string::size();
    bVar2 = false;
    if (iVar3 < iVar9) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
      bVar2 = *pcVar4 == '*';
    }
    if (!bVar2) break;
    *(int *)&(root->sons).
             super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start =
         *(int *)&(root->sons).
                  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  return local_28;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::factor_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  if (expr[curr_pos] == '(') {
    curr_pos++;
    auto son = expression_eval(expr, curr_pos);
    root->first_pos = son->first_pos;
    root->last_pos = son->last_pos;
    root->sons.push_back(son);
    root->nullable = son->nullable;
    root->wipe_sons();
  }
  else {
    if (expr[curr_pos] == kLambda)
      root->nullable = true;
    else if (!is_letter(expr[curr_pos]) && expr[curr_pos] != '#')
      root->nullable = true, --curr_pos;
    else {
      ++leaves_count_;
      follow_pos_.resize((size_t)leaves_count_ + 1);
      what_letter_.resize((size_t)leaves_count_ + 1);
      root->nullable = false;
      root->first_pos = {leaves_count_};
      root->last_pos = {leaves_count_};
      root->leaf_index = leaves_count_;
      what_letter_[leaves_count_] = expr[curr_pos];
    }
  }

  if (++curr_pos < (int)expr.size() && expr[curr_pos] == '*') {
    root->nullable = true;
    for (int first : root->last_pos)
      for (int second : root->first_pos)
        follow_pos_[first].insert(second);
  }
  while (curr_pos < (int)expr.size() && expr[curr_pos] == '*')
    curr_pos++;
  return root;
}